

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_levels_db(feed_db_t *db,level_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_f8 [8];
  char qr [56];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  level_t record;
  level_t **records_local;
  feed_db_t *db_local;
  
  record.name._56_8_ = records;
  db_local._4_4_ = count_rows_db(db,"levels");
  stmt._4_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_f8,"SELECT level_id, level_index, level_name FROM `levels`;",0x38);
    sqlite3_prepare_v2(db->conn,local_f8,-1,(sqlite3_stmt **)(qr + 0x30),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x88);
    *(void **)record.name._56_8_ = pvVar2;
    if (*(long *)record.name._56_8_ == 0) {
      sqlite3_finalize((sqlite3_stmt *)qr._48_8_);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step((sqlite3_stmt *)qr._48_8_);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_level((level_t *)&record_count);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._48_8_,0);
        strcpy((char *)&record_count,(char *)puVar3);
        record.id._56_8_ = sqlite3_column_double((sqlite3_stmt *)qr._48_8_,1);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._48_8_,2);
        strcpy((char *)&record.index,(char *)puVar3);
        memcpy((void *)(*(long *)record.name._56_8_ + (long)stmt._4_4_ * 0x88),&record_count,0x88);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < db_local._4_4_);
      sqlite3_finalize((sqlite3_stmt *)qr._48_8_);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_levels_db(feed_db_t *db, level_t **records) {

    level_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "levels");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "level_id, level_index, level_name "
                "FROM `levels`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_level(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        record.index = sqlite3_column_double(stmt, 1);
        strcpy(record.name, sqlite3_column_text(stmt, 2));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}